

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImpl.cpp
# Opt level: O3

void __thiscall sf::priv::WindowImpl::processJoystickEvents(WindowImpl *this)

{
  iterator *piVar1;
  bool bVar2;
  _Elt_pointer pEVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined3 uVar7;
  deque<sf::Event,std::allocator<sf::Event>> *this_00;
  float *pfVar8;
  JoystickState *pJVar9;
  JoystickManager *pJVar10;
  JoystickState *pJVar11;
  float (*pafVar12) [8];
  JoystickCaps *pJVar13;
  long lVar14;
  bool *pbVar15;
  uint j;
  ulong uVar16;
  byte *pbVar17;
  JoystickState *pJVar18;
  ulong uVar19;
  float (*pafVar20) [8];
  uint joystick;
  long lVar21;
  byte bVar22;
  float fVar23;
  Event event;
  JoystickCaps caps;
  JoystickState previousState;
  Event local_cc;
  bool *local_b8;
  float local_ac;
  deque<sf::Event,std::allocator<sf::Event>> *local_a8;
  float *local_a0;
  undefined8 local_98;
  undefined4 local_90;
  float (*local_88) [8];
  JoystickState *local_80;
  byte local_74 [36];
  byte abStack_50 [32];
  
  bVar22 = 0;
  pJVar10 = JoystickManager::getInstance();
  JoystickManager::update(pJVar10);
  local_80 = this->m_joystickStates;
  local_a8 = (deque<sf::Event,std::allocator<sf::Event>> *)&this->m_events;
  pafVar20 = this->m_previousAxes;
  local_a0 = this->m_joystickStates[0].axes;
  local_b8 = this->m_joystickStates[0].buttons;
  lVar21 = 0;
  local_88 = pafVar20;
  do {
    pJVar9 = local_80;
    pJVar18 = local_80 + lVar21;
    pJVar11 = pJVar18;
    pbVar17 = local_74;
    for (lVar14 = 0x11; lVar14 != 0; lVar14 = lVar14 + -1) {
      uVar4 = pJVar11->field_0x1;
      uVar5 = pJVar11->field_0x2;
      uVar6 = pJVar11->field_0x3;
      pbVar17[0] = pJVar11->connected;
      pbVar17[1] = uVar4;
      pbVar17[2] = uVar5;
      pbVar17[3] = uVar6;
      pJVar11 = (JoystickState *)((long)pJVar11 + (ulong)bVar22 * -8 + 4);
      pbVar17 = pbVar17 + ((ulong)bVar22 * -2 + 1) * 4;
    }
    pJVar10 = JoystickManager::getInstance();
    joystick = (uint)lVar21;
    pJVar11 = JoystickManager::getState(pJVar10,joystick);
    for (lVar14 = 0x11; lVar14 != 0; lVar14 = lVar14 + -1) {
      uVar7 = *(undefined3 *)&pJVar11->field_0x1;
      pJVar18->connected = pJVar11->connected;
      *(undefined3 *)&pJVar18->field_0x1 = uVar7;
      pJVar11 = (JoystickState *)((long)pJVar11 + (ulong)bVar22 * -8 + 4);
      pJVar18 = (JoystickState *)((long)pJVar18 + (ulong)bVar22 * -8 + 4);
    }
    bVar2 = pJVar9[lVar21].connected;
    if ((bool)local_74[0] != bVar2) {
      local_cc.type = JoystickDisconnected - bVar2;
      pEVar3 = (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (pEVar3 == (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        local_cc.field_1.size.width = joystick;
        std::deque<sf::Event,std::allocator<sf::Event>>::_M_push_back_aux<sf::Event_const&>
                  (local_a8,&local_cc);
      }
      else {
        (pEVar3->field_1).mouseWheelScroll.y = local_cc.field_1.mouseWheelScroll.y;
        *(ulong *)pEVar3 = CONCAT44(joystick,local_cc.type);
        *(ulong *)((long)&pEVar3->field_1 + 4) =
             CONCAT44(local_cc.field_1.mouseButton.y,local_cc.field_1.size.height);
        piVar1 = &(this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>.
                  _M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
        local_cc.field_1.size.width = joystick;
      }
      if (bVar2 != false) {
        pafVar12 = local_88 + lVar21;
        *(float *)((long)pafVar12 + 0x10) = 0.0;
        *(float *)((long)pafVar12 + 0x14) = 0.0;
        *(float *)((long)pafVar12 + 0x18) = 0.0;
        *(float *)((long)pafVar12 + 0x1c) = 0.0;
        *(float *)((long)pafVar12 + 0) = 0.0;
        *(float *)((long)pafVar12 + 4) = 0.0;
        *(float *)((long)pafVar12 + 8) = 0.0;
        *(float *)((long)pafVar12 + 0xc) = 0.0;
      }
    }
    pfVar8 = local_a0;
    pbVar15 = local_b8;
    if (bVar2 != false) {
      pJVar10 = JoystickManager::getInstance();
      pJVar13 = JoystickManager::getCapabilities(pJVar10,joystick);
      this_00 = local_a8;
      local_98._0_4_ = pJVar13->buttonCount;
      local_98._4_1_ = pJVar13->axes[0];
      local_98._5_1_ = pJVar13->axes[1];
      local_98._6_1_ = pJVar13->axes[2];
      local_98._7_1_ = pJVar13->axes[3];
      local_90 = *(undefined4 *)(pJVar13->axes + 4);
      lVar14 = 0;
      do {
        if ((*(char *)((long)&local_98 + lVar14 + 4) == '\x01') &&
           (fVar23 = pfVar8[lVar14], this->m_joystickThreshold <= ABS(fVar23 - (*pafVar20)[lVar14]))
           ) {
          local_cc.type = JoystickMoved;
          local_cc.field_1.size.height = (uint)lVar14;
          pEVar3 = (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_cur;
          local_cc.field_1.joystickMove.position = fVar23;
          if (pEVar3 == (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            local_cc.field_1.size.width = joystick;
            local_ac = fVar23;
            std::deque<sf::Event,std::allocator<sf::Event>>::_M_push_back_aux<sf::Event_const&>
                      (this_00,&local_cc);
            fVar23 = local_ac;
          }
          else {
            (pEVar3->field_1).mouseWheelScroll.y = local_cc.field_1.mouseWheelScroll.y;
            *(ulong *)pEVar3 = CONCAT44(joystick,0x10);
            *(ulong *)((long)&pEVar3->field_1 + 4) = CONCAT44(fVar23,local_cc.field_1.size.height);
            piVar1 = &(this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>.
                      _M_impl.super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
            local_cc.field_1.size.width = joystick;
          }
          (*pafVar20)[lVar14] = fVar23;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 8);
      uVar16 = local_98 & 0xffffffff;
      pbVar15 = local_b8;
      if (uVar16 != 0) {
        uVar19 = 0;
        do {
          bVar2 = pbVar15[uVar19];
          if ((bool)abStack_50[uVar19] != bVar2) {
            local_cc.type = bVar2 ^ JoystickButtonReleased;
            local_cc.field_1.size.height = (uint)uVar19;
            pEVar3 = (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (pEVar3 == (this->m_events).c.
                          super__Deque_base<sf::Event,_std::allocator<sf::Event>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_last + -1) {
              local_cc.field_1.size.width = joystick;
              std::deque<sf::Event,std::allocator<sf::Event>>::_M_push_back_aux<sf::Event_const&>
                        (this_00,&local_cc);
              pbVar15 = local_b8;
            }
            else {
              (pEVar3->field_1).mouseWheelScroll.y = local_cc.field_1.mouseWheelScroll.y;
              *(ulong *)pEVar3 = CONCAT44(joystick,(uint)bVar2) ^ 0xf;
              *(ulong *)((long)&pEVar3->field_1 + 4) =
                   CONCAT44(local_cc.field_1.mouseButton.y,local_cc.field_1.size.height);
              piVar1 = &(this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>.
                        _M_impl.super__Deque_impl_data._M_finish;
              piVar1->_M_cur = piVar1->_M_cur + 1;
              local_cc.field_1.size.width = joystick;
            }
          }
          uVar19 = uVar19 + 1;
        } while (uVar16 != uVar19);
      }
    }
    lVar21 = lVar21 + 1;
    local_a0 = local_a0 + 0x11;
    pafVar20 = pafVar20 + 1;
    local_b8 = pbVar15 + 0x44;
  } while (lVar21 != 8);
  return;
}

Assistant:

void WindowImpl::processJoystickEvents()
{
    // First update the global joystick states
    JoystickManager::getInstance().update();

    for (unsigned int i = 0; i < Joystick::Count; ++i)
    {
        // Copy the previous state of the joystick and get the new one
        JoystickState previousState = m_joystickStates[i];
        m_joystickStates[i] = JoystickManager::getInstance().getState(i);

        // Connection state
        bool connected = m_joystickStates[i].connected;
        if (previousState.connected ^ connected)
        {
            Event event;
            event.type = connected ? Event::JoystickConnected : Event::JoystickDisconnected;
            event.joystickConnect.joystickId = i;
            pushEvent(event);

            // Clear previous axes positions
            if (connected)
                std::fill_n(m_previousAxes[i], static_cast<std::size_t>(Joystick::AxisCount), 0.f);
        }

        if (connected)
        {
            JoystickCaps caps = JoystickManager::getInstance().getCapabilities(i);

            // Axes
            for (unsigned int j = 0; j < Joystick::AxisCount; ++j)
            {
                if (caps.axes[j])
                {
                    Joystick::Axis axis = static_cast<Joystick::Axis>(j);
                    float prevPos = m_previousAxes[i][axis];
                    float currPos = m_joystickStates[i].axes[axis];
                    if (std::abs(currPos - prevPos) >= m_joystickThreshold)
                    {
                        Event event;
                        event.type = Event::JoystickMoved;
                        event.joystickMove.joystickId = i;
                        event.joystickMove.axis = axis;
                        event.joystickMove.position = currPos;
                        pushEvent(event);

                        m_previousAxes[i][axis] = currPos;
                    }
                }
            }

            // Buttons
            for (unsigned int j = 0; j < caps.buttonCount; ++j)
            {
                bool prevPressed = previousState.buttons[j];
                bool currPressed = m_joystickStates[i].buttons[j];

                if (prevPressed ^ currPressed)
                {
                    Event event;
                    event.type = currPressed ? Event::JoystickButtonPressed : Event::JoystickButtonReleased;
                    event.joystickButton.joystickId = i;
                    event.joystickButton.button = j;
                    pushEvent(event);
                }
            }
        }
    }
}